

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O2

int Nwk_ManRetimeVerifyCutForward(Nwk_Man_t *pMan,Vec_Ptr_t *vNodes)

{
  int iVar1;
  void *pvVar2;
  Nwk_Obj_t *pObj;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    if (vNodes->nSize <= iVar3) {
      Nwk_ManIncrementTravId(pMan);
      for (iVar3 = 0; iVar3 < pMan->vCos->nSize; iVar3 = iVar3 + 1) {
        pObj = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCos,iVar3);
        iVar1 = Nwk_ManVerifyCut_rec(pObj);
        if (iVar1 == 0) {
          puts("Nwk_ManRetimeVerifyCutForward(): Internal cut verification failed.");
        }
      }
      for (iVar3 = 0; iVar3 < vNodes->nSize; iVar3 = iVar3 + 1) {
        pvVar2 = Vec_PtrEntry(vNodes,iVar3);
        *(byte *)((long)pvVar2 + 0x20) = *(byte *)((long)pvVar2 + 0x20) & 0xef;
      }
      return 1;
    }
    pvVar2 = Vec_PtrEntry(vNodes,iVar3);
    if ((*(uint *)((long)pvVar2 + 0x20) & 0x10) != 0) break;
    *(uint *)((long)pvVar2 + 0x20) = *(uint *)((long)pvVar2 + 0x20) | 0x10;
    iVar3 = iVar3 + 1;
  }
  __assert_fail("pObj->MarkA == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFlow.c"
                ,0x191,"int Nwk_ManRetimeVerifyCutForward(Nwk_Man_t *, Vec_Ptr_t *)");
}

Assistant:

int Nwk_ManRetimeVerifyCutForward( Nwk_Man_t * pMan, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pObj;
    int i;
    // mark the nodes
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
    {
        assert( pObj->MarkA == 0 );
        pObj->MarkA = 1;
    }
    // traverse from the COs
    Nwk_ManIncrementTravId( pMan );
    Nwk_ManForEachCo( pMan, pObj, i )
        if ( !Nwk_ManVerifyCut_rec( pObj ) )
            printf( "Nwk_ManRetimeVerifyCutForward(): Internal cut verification failed.\n" );
    // unmark the nodes
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
        pObj->MarkA = 0;
    return 1;
}